

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds00_reverse.cpp
# Opt level: O2

void reverse(vector<int,_std::allocator<int>_> *v,int a,int b)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  
  piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)a;
  for (lVar4 = lVar3; lVar4 <= (b + a) / 2; lVar4 = lVar4 + 1) {
    iVar1 = piVar2[lVar4];
    piVar2[lVar4] = piVar2[lVar3 + (long)b + -1];
    piVar2[lVar3 + (long)b + -1] = iVar1;
  }
  return;
}

Assistant:

void reverse(vector<int> &v, int a, int b) {
    // write your code only in this function
    auto beg = v.begin();
    for (int i = a; i < (a + b) / 2 + 1; i++) {
        iter_swap(beg + i, beg + a + b - 1);
    }
}